

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::UniformGrid2::~UniformGrid2(UniformGrid2 *this)

{
  UniformGrid2 *this_local;
  
  Array<unsigned_int>::~Array(&this->m_traversedCellOffsets);
  Array<unsigned_int>::~Array(&this->m_potentialEdges);
  Array<unsigned_int>::~Array(&this->m_cellData);
  Array<unsigned_int>::~Array(&this->m_cellDataOffsets);
  Array<unsigned_int>::~Array(&this->m_edges);
  return;
}

Assistant:

void reset(const Vector2 *positions, const uint32_t *indices = nullptr, uint32_t reserveEdgeCount = 0)
	{
		m_edges.clear();
		if (reserveEdgeCount > 0)
			m_edges.reserve(reserveEdgeCount);
		m_positions = positions;
		m_indices = indices;
		m_cellDataOffsets.clear();
	}